

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void SHA1Update(SHA1_CTX *context,uchar *data,uint32_t len)

{
  uint uVar1;
  ulong __n;
  ulong uVar2;
  
  uVar1 = context->count[0];
  context->count[0] = len * 8 + uVar1;
  context->count[1] = context->count[1] + (len >> 0x1d) + (uint)CARRY4(len * 8,uVar1);
  uVar1 = uVar1 >> 3 & 0x3f;
  uVar2 = (ulong)uVar1;
  if (uVar1 + len < 0x40) {
    __n = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar1);
    memcpy(context->buffer + uVar2,data,__n);
    SHA1Transform(context->state,context->buffer);
    uVar2 = 0;
    for (; (int)__n + 0x3fU < len; __n = (ulong)((int)__n + 0x40)) {
      SHA1Transform(context->state,data + __n);
    }
  }
  memcpy(context->buffer + uVar2,data + __n,(ulong)(len - (int)__n));
  return;
}

Assistant:

void SHA1Update(
    SHA1_CTX * context,
    const unsigned char *data,
    uint32_t len
)
{
    uint32_t i;

    uint32_t j;

    j = context->count[0];
    if ((context->count[0] += len << 3) < j)
        context->count[1]++;
    context->count[1] += (len >> 29);
    j = (j >> 3) & 63;
    if ((j + len) > 63)
    {
        memcpy(&context->buffer[j], data, (i = 64 - j));
        SHA1Transform(context->state, context->buffer);
        for (; i + 63 < len; i += 64)
        {
            SHA1Transform(context->state, &data[i]);
        }
        j = 0;
    }
    else
        i = 0;
    memcpy(&context->buffer[j], &data[i], len - i);
}